

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O0

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_t sVar1;
  bool bVar2;
  reference pbVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  allocator local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  ulong local_330;
  size_t binLen;
  size_t srcLen;
  char *bin;
  char *src;
  undefined1 local_2f0 [8];
  ostringstream e;
  allocator local_171;
  string local_170;
  undefined1 local_150 [8];
  string binPath;
  allocator local_109;
  undefined1 local_108 [8];
  string error;
  string srcPath;
  string local_c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  const_iterator i;
  string local_88 [7];
  bool excludeFromAll;
  string binArg;
  string *srcArg;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddSubDirectoryCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_00528b22;
  }
  binArg.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local,0);
  std::__cxx11::string::string(local_88);
  i._M_current._7_1_ = 0;
  local_98._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_98);
  while( true ) {
    local_a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
    bVar2 = __gnu_cxx::operator!=(&local_98,&local_a0);
    if (!bVar2) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_98);
    bVar2 = std::operator==(pbVar3,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      i._M_current._7_1_ = 1;
    }
    else {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_c0,"called with incorrect number of arguments",
                   (allocator *)(srcPath.field_2._M_local_buf + 0xf));
        cmCommand::SetError(&this->super_cmCommand,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)(srcPath.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 0;
        srcPath.field_2._8_4_ = 1;
        goto LAB_00528b0c;
      }
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_98);
      std::__cxx11::string::operator=(local_88,(string *)pbVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_98);
  }
  std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
  if (bVar2) {
    std::__cxx11::string::operator=
              ((string *)(error.field_2._M_local_buf + 8),(string *)binArg.field_2._8_8_);
  }
  else {
    pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),pcVar4);
    std::__cxx11::string::operator+=((string *)(error.field_2._M_local_buf + 8),"/");
    std::__cxx11::string::operator+=
              ((string *)(error.field_2._M_local_buf + 8),(string *)binArg.field_2._8_8_);
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory((string *)((long)&error.field_2 + 8));
  if (bVar2) {
    cmsys::SystemTools::CollapseFullPath
              ((string *)((long)&binPath.field_2 + 8),(string *)((long)&error.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(error.field_2._M_local_buf + 8),
               (string *)(binPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(binPath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_150);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_150,local_88);
      }
      else {
        pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::operator=((string *)local_150,pcVar4);
        std::__cxx11::string::operator+=((string *)local_150,"/");
        std::__cxx11::string::operator+=((string *)local_150,local_88);
      }
LAB_00528a54:
      cmsys::SystemTools::CollapseFullPath(&local_3b8,(string *)local_150);
      std::__cxx11::string::operator=((string *)local_150,(string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      cmMakefile::AddSubDirectory
                ((this->super_cmCommand).Makefile,(string *)((long)&error.field_2 + 8),
                 (string *)local_150,(bool)(i._M_current._7_1_ & 1),true);
      this_local._7_1_ = 1;
      srcPath.field_2._8_4_ = 1;
    }
    else {
      pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,pcVar4,&local_171);
      bVar2 = cmsys::SystemTools::IsSubDirectory((string *)((long)&error.field_2 + 8),&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bin = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        srcLen = (size_t)cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        binLen = strlen(bin);
        local_330 = strlen((char *)srcLen);
        sVar1 = srcLen;
        if ((binLen != 0) && (bin[binLen - 1] == '/')) {
          binLen = binLen - 1;
        }
        if ((local_330 != 0) && (*(char *)(srcLen + (local_330 - 1)) == '/')) {
          local_330 = local_330 - 1;
        }
        uVar5 = local_330;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_370,(char *)sVar1,uVar5,&local_371);
        std::__cxx11::string::substr((ulong)&local_398,(ulong)((long)&error.field_2 + 8));
        std::operator+(&local_350,&local_370,&local_398);
        std::__cxx11::string::operator=((string *)local_150,(string *)&local_350);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator((allocator<char> *)&local_371);
        goto LAB_00528a54;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
      poVar6 = std::operator<<((ostream *)local_2f0,
                               "not given a binary directory but the given source directory ");
      poVar6 = std::operator<<(poVar6,"\"");
      poVar6 = std::operator<<(poVar6,(string *)(error.field_2._M_local_buf + 8));
      poVar6 = std::operator<<(poVar6,"\" is not a subdirectory of \"");
      pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      poVar6 = std::operator<<(poVar6,pcVar4);
      poVar6 = std::operator<<(poVar6,"\".  ");
      poVar6 = std::operator<<(poVar6,"When specifying an out-of-tree source a binary directory ");
      std::operator<<(poVar6,"must be explicitly specified.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&src);
      std::__cxx11::string::~string((string *)&src);
      this_local._7_1_ = 0;
      srcPath.field_2._8_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
    }
    std::__cxx11::string::~string((string *)local_150);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_108,"given source \"",&local_109);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::operator+=((string *)local_108,(string *)binArg.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_108,"\" which is not an existing directory.");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_108);
    this_local._7_1_ = 0;
    srcPath.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_108);
  }
  std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
LAB_00528b0c:
  std::__cxx11::string::~string(local_88);
LAB_00528b22:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the binpath
  std::string const& srcArg = args[0];
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  for (; i != args.end(); ++i) {
    if (*i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = *i;
    } else {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg.c_str())) {
    srcPath = srcArg;
  } else {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
  }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(
          srcPath, this->Makefile->GetCurrentSourceDirectory())) {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const char* src = this->Makefile->GetCurrentSourceDirectory();
    const char* bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = strlen(src);
    size_t binLen = strlen(bin);
    if (srcLen > 0 && src[srcLen - 1] == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin[binLen - 1] == '/') {
      --binLen;
    }
    binPath = std::string(bin, binLen) + srcPath.substr(srcLen);
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg.c_str())) {
      binPath = binArg;
    } else {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, true);

  return true;
}